

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

optional<long> __thiscall
anon_unknown.dwarf_2e6623f::MiniscriptDescriptor::MaxSatisfactionElems(MiniscriptDescriptor *this)

{
  bool bVar1;
  element_type *peVar2;
  _Storage<long,_true> _Var3;
  undefined8 in_RDX;
  long in_FS_OFFSET;
  optional<long> oVar4;
  
  peVar2 = (this->m_node).
           super___shared_ptr<const_miniscript::Node<unsigned_int>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  bVar1 = (peVar2->ss).sat.valid;
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_ =
       (undefined7)((ulong)in_RDX >> 8);
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = bVar1;
  _Var3._M_value = ((_Storage<long,_true> *)(in_FS_OFFSET + 0x28))->_M_value;
  if (bVar1 == true) {
    _Var3._0_4_ = ((peVar2->ss).sat.netdiff + 1) - (uint)(((peVar2->typ).m_flags & 0xd) == 0);
    _Var3._M_value._4_4_ = 0;
  }
  if (*(ulong *)(in_FS_OFFSET + 0x28) == ((_Storage<long,_true> *)(in_FS_OFFSET + 0x28))->_M_value)
  {
    oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = _Var3._M_value;
    return (optional<long>)
           oVar4.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> MaxSatisfactionElems() const override {
        return m_node->GetStackSize();
    }